

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O2

int Cudd_PrintLinear(DdManager *table)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  ulong local_58;
  
  uVar1 = table->linearSize;
  uVar2 = ((int)(uVar1 - 1) >> 6) + 1;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  local_58 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = 0;
  }
  do {
    if (local_58 == uVar4) {
      return 1;
    }
    for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      lVar6 = table->linear[uVar8 + local_58 * (long)(int)uVar2];
      iVar7 = 0x40;
      while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
        iVar3 = fprintf((FILE *)table->out,"%ld",(ulong)((uint)lVar6 & 1));
        if (iVar3 == 0) {
          return 0;
        }
        lVar6 = lVar6 >> 1;
      }
    }
    iVar7 = fprintf((FILE *)table->out,"\n");
    local_58 = local_58 + 1;
  } while (iVar7 != 0);
  return 0;
}

Assistant:

int
Cudd_PrintLinear(
  DdManager * table)
{
    int i,j,k;
    int retval;
    int nvars = table->linearSize;
    int wordsPerRow = ((nvars - 1) >> LOGBPL) + 1;
    long word;

    for (i = 0; i < nvars; i++) {
        for (j = 0; j < wordsPerRow; j++) {
            word = table->linear[i*wordsPerRow + j];
            for (k = 0; k < BPL; k++) {
                retval = fprintf(table->out,"%ld",word & 1);
                if (retval == 0) return(0);
                word >>= 1;
            }
        }
        retval = fprintf(table->out,"\n");
        if (retval == 0) return(0);
    }
    return(1);

}